

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void accumulate_this_frame_stats
               (FIRSTPASS_STATS *stats,double mod_frame_err,GF_GROUP_STATS *gf_stats)

{
  GF_GROUP_STATS *gf_stats_local;
  double mod_frame_err_local;
  FIRSTPASS_STATS *stats_local;
  
  gf_stats->gf_group_err = mod_frame_err + gf_stats->gf_group_err;
  gf_stats->gf_group_raw_error = stats->coded_error + gf_stats->gf_group_raw_error;
  gf_stats->gf_group_skip_pct = stats->intra_skip_pct + gf_stats->gf_group_skip_pct;
  gf_stats->gf_group_inactive_zone_rows =
       stats->inactive_zone_rows + gf_stats->gf_group_inactive_zone_rows;
  return;
}

Assistant:

static void accumulate_this_frame_stats(const FIRSTPASS_STATS *stats,
                                        const double mod_frame_err,
                                        GF_GROUP_STATS *gf_stats) {
  gf_stats->gf_group_err += mod_frame_err;
#if GROUP_ADAPTIVE_MAXQ
  gf_stats->gf_group_raw_error += stats->coded_error;
#endif
  gf_stats->gf_group_skip_pct += stats->intra_skip_pct;
  gf_stats->gf_group_inactive_zone_rows += stats->inactive_zone_rows;
}